

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors.cpp
# Opt level: O0

int __thiscall SensorBase::init(SensorBase *this,EVP_PKEY_CTX *ctx)

{
  FILE *__stream;
  int iVar1;
  value_type *pvVar2;
  mapped_type *pmVar3;
  undefined8 extraout_RAX;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  float local_234;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  path local_210;
  undefined1 local_1e8 [8];
  path offset_path;
  float local_19c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  path local_178;
  undefined1 local_150 [8];
  path scale_path;
  path local_108;
  undefined1 local_e0 [8];
  path name_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *_sensor_basename_local;
  SensorBase *pSStack_18;
  int id_local;
  SensorBase *this_local;
  
  _sensor_basename_local._4_4_ = (int)ctx;
  pSStack_18 = this;
  std::__cxx11::to_string(&local_68,_sensor_basename_local._4_4_);
  std::operator+(&local_48,"/sys/bus/iio/devices/iio:device",&local_68);
  std::filesystem::__cxx11::path::operator=(&this->sysfspath,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::to_string((string *)&name_path._M_cmpts,_sensor_basename_local._4_4_);
  std::operator+(&local_98,"/dev/iio:device",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &name_path._M_cmpts);
  std::filesystem::__cxx11::path::operator=(&this->devbufpath,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&name_path._M_cmpts);
  std::__cxx11::string::operator=((string *)&this->sensor_basename,in_RDX);
  std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
            (&local_108,(char (*) [5])"name",auto_format);
  std::filesystem::__cxx11::operator/((path *)local_e0,&this->sysfspath,&local_108);
  std::filesystem::__cxx11::path::~path(&local_108);
  pvVar2 = std::filesystem::__cxx11::path::c_str((path *)local_e0);
  readstr_abi_cxx11_((string *)&scale_path._M_cmpts,pvVar2,0x100);
  std::__cxx11::string::operator=((string *)&this->type,(string *)&scale_path._M_cmpts);
  std::__cxx11::string::~string((string *)&scale_path._M_cmpts);
  std::operator+(&local_198,&this->sensor_basename,"_scale");
  std::filesystem::__cxx11::path::path(&local_178,&local_198,auto_format);
  std::filesystem::__cxx11::operator/((path *)local_150,&this->sysfspath,&local_178);
  std::filesystem::__cxx11::path::~path(&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  pvVar2 = std::filesystem::__cxx11::path::c_str((path *)local_150);
  local_19c = readfloat(pvVar2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &offset_path._M_cmpts,&this->sensor_basename,"_scale");
  pmVar3 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
           ::operator[](&this->dict,(key_type *)&offset_path._M_cmpts);
  std::any::operator=(pmVar3,&local_19c);
  std::__cxx11::string::~string((string *)&offset_path._M_cmpts);
  std::operator+(&local_230,&this->sensor_basename,"_offset");
  std::filesystem::__cxx11::path::path(&local_210,&local_230,auto_format);
  std::filesystem::__cxx11::operator/((path *)local_1e8,&this->sysfspath,&local_210);
  std::filesystem::__cxx11::path::~path(&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  pvVar2 = std::filesystem::__cxx11::path::c_str((path *)local_1e8);
  local_234 = readfloat(pvVar2);
  std::operator+(&local_258,&this->sensor_basename,"_offset");
  pmVar3 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
           ::operator[](&this->dict,&local_258);
  std::any::operator=(pmVar3,&local_234);
  std::__cxx11::string::~string((string *)&local_258);
  reset(this);
  iVar1 = pipe(this->qpipe);
  ignore_result<int>(iVar1);
  std::
  vector<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scan_t>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scan_t>_>_>
  ::clear(&this->enabled_scan_elem);
  (**this->_vptr_SensorBase)();
  (*this->_vptr_SensorBase[1])();
  enable_buffer(this);
  pvVar2 = std::filesystem::__cxx11::path::c_str(&this->devbufpath);
  iVar1 = open(pvVar2,0);
  this->devfd = iVar1;
  __stream = _stderr;
  this_local._7_1_ = this->devfd == -1;
  if ((bool)this_local._7_1_) {
    pvVar2 = std::filesystem::__cxx11::path::c_str(&this->devbufpath);
    fprintf(__stream,"%c: failed to open the iio buffer device: %s\n",0x45,pvVar2);
  }
  std::filesystem::__cxx11::path::~path((path *)local_1e8);
  std::filesystem::__cxx11::path::~path((path *)local_150);
  std::filesystem::__cxx11::path::~path((path *)local_e0);
  return (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),this_local._7_1_) & 0xffffff01;
}

Assistant:

bool SensorBase::init(int id,std::string _sensor_basename)
{
	sysfspath=IIODEV_SYSFS_PATH_BASE+std::to_string(id);
	devbufpath=DEV_PATH+std::to_string(id);
	sensor_basename=_sensor_basename;

	using filesystem::path;
	path name_path=sysfspath/"name";
	type=readstr(name_path.c_str());
	path scale_path=sysfspath/(sensor_basename+"_scale");
	dict[sensor_basename+"_scale"]=readfloat(scale_path.c_str());
	path offset_path=sysfspath/(sensor_basename+"_offset");
	dict[sensor_basename+"_offset"]=readfloat(offset_path.c_str());

	reset();
	ignore_result(pipe(qpipe));
	enabled_scan_elem.clear();
	enable_scan_elements();
	update_values();
	enable_buffer();
	devfd=open(devbufpath.c_str(),O_RDONLY);
	if(!~devfd)
		return LOG('E',"failed to open the iio buffer device: %s",devbufpath.c_str()),1;
	return 0;
}